

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_conn.c
# Opt level: O0

int csp_conn_print_table_str(char *str_buf,int str_size)

{
  ulong uVar1;
  size_t sVar2;
  int in_ESI;
  char *in_RDI;
  char buf [100];
  csp_conn_t *conn;
  uint i;
  uint start;
  char local_98 [104];
  csp_conn_t *local_30;
  uint local_24;
  undefined4 local_20;
  int local_1c;
  char *local_18;
  
  local_20 = 0;
  local_24 = 0;
  local_1c = in_ESI;
  local_18 = in_RDI;
  while( true ) {
    if (7 < local_24) {
      return 0;
    }
    uVar1 = (ulong)local_24;
    local_30 = arr_conn + uVar1;
    snprintf(local_98,100,"[%02u %p] S:%u, %u -> %u, %u -> %u (%u)\n",(ulong)local_24,local_30,
             (ulong)(uint)arr_conn[uVar1].state,(uint)arr_conn[uVar1].idin.src,
             (uint)arr_conn[uVar1].idin.dst,(uint)arr_conn[uVar1].idin.dport,
             (uint)arr_conn[uVar1].idin.sport,(uint)arr_conn[uVar1].sport_outgoing);
    strncat(local_18,local_98,(long)local_1c);
    sVar2 = strlen(local_98);
    local_1c = local_1c - (int)sVar2;
    if (local_1c < 1) break;
    local_24 = local_24 + 1;
  }
  return 0;
}

Assistant:

int csp_conn_print_table_str(char * str_buf, int str_size) {

	/* Display up to 10 connections */
	unsigned int start = (CSP_CONN_MAX > 10) ? (CSP_CONN_MAX - 10) : 0;

	for (unsigned int i = start; i < CSP_CONN_MAX; i++) {
		csp_conn_t * conn = &arr_conn[i];
		char buf[100];
		snprintf(buf, sizeof(buf), "[%02u %p] S:%u, %u -> %u, %u -> %u (%u)\n",
				 i, (void *)conn, conn->state, conn->idin.src, conn->idin.dst,
				 conn->idin.dport, conn->idin.sport, conn->sport_outgoing);

		strncat(str_buf, buf, str_size);
		if ((str_size -= strlen(buf)) <= 0) {
			break;
		}
	}

	return CSP_ERR_NONE;
}